

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::anon_unknown_0::FragmentTextureWorkloadCullCase::init
          (FragmentTextureWorkloadCullCase *this,EVP_PKEY_CTX *ctx)

{
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)0>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>_>
  data_00;
  int iVar1;
  int extraout_EAX;
  undefined4 extraout_var;
  TypedObjectWrapper<(glu::ObjectType)0> *this_00;
  ulong in_stack_ffffffffffffffb8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Functions *gl;
  
  iVar1 = (*((this->super_FragmentWorkloadCullCase).super_RelativeChangeCase.super_BaseCase.
            m_renderCtx)->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data,0x10000,&stack0xffffffffffffffc0,(allocator_type *)&stack0xffffffffffffffbf);
  this_00 = (TypedObjectWrapper<(glu::ObjectType)0> *)operator_new(0x18);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper(this_00,gl);
  data_00._8_8_ = 0;
  data_00.ptr = (TypedObjectWrapper<(glu::ObjectType)0> *)in_stack_ffffffffffffffb8;
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)0>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>_>
  ::assignData(&(this->m_texture).
                super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)0>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>_>
               ,data_00);
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)0>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>_>
  ::~UniqueBase((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)0>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>_>
                 *)&stack0xffffffffffffffc0);
  (*gl->bindTexture)(0xde1,(uint)((this->m_texture).
                                  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)0>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)0>_>_>
                                  .m_data.ptr != (TypedObjectWrapper<(glu::ObjectType)0> *)0x0));
  (*gl->texImage2D)(0xde1,0,0x8058,0x80,0x80,0,0x1908,0x1401,
                    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  (*gl->texParameteri)(0xde1,0x2801,0x2600);
  (*gl->texParameteri)(0xde1,0x2800,0x2600);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return extraout_EAX;
}

Assistant:

void FragmentTextureWorkloadCullCase::init (void)
{
	const glw::Functions&	gl		= m_renderCtx.getFunctions();
	const int				size	= 128;
	const vector<deUint8>	data	(size*size*4, 255);

	m_texture = MovePtr<glu::Texture>(new glu::Texture(gl));

	gl.bindTexture(GL_TEXTURE_2D, m_texture);
	gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA8, size, size, 0, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
}